

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

Uint64 Diligent::GetStagingTextureLocationOffset
                 (TextureDesc *TexDesc,Uint32 ArraySlice,Uint32 MipLevel,Uint32 Alignment,
                 Uint32 LocationX,Uint32 LocationY,Uint32 LocationZ)

{
  RESOURCE_DIMENSION RVar1;
  Uint64 UVar2;
  Uint32 UVar3;
  TextureFormatAttribs *pTVar4;
  uint uVar5;
  undefined4 in_register_0000000c;
  char (*Args_1) [135];
  Uint32 UVar6;
  ulong uVar7;
  Uint64 UVar8;
  Uint32 UVar9;
  byte bVar10;
  Uint32 UVar11;
  undefined4 in_register_00000084;
  long lVar12;
  string msg_2;
  string msg;
  uint local_98;
  Uint32 local_94;
  string local_90;
  undefined1 local_70 [40];
  Uint64 local_48;
  Uint32 local_3c;
  Uint32 local_38;
  Uint32 local_34;
  
  Args_1 = (char (*) [135])CONCAT44(in_register_0000000c,Alignment);
  UVar11 = LocationX;
  local_94 = Alignment;
  if (TexDesc->MipLevels != 0) {
    RVar1 = TexDesc->Type;
    Args_1 = (char (*) [135])CONCAT71((int7)((ulong)Args_1 >> 8),RVar1);
    if ((((((byte)(0x1a8 >> (RVar1 & 0x1f)) & RVar1 < RESOURCE_DIM_NUM_DIMENSIONS &
           (TexDesc->field_3).ArraySize == 0) == 0) && (TexDesc->Width != 0)) &&
        (TexDesc->Height != 0)) && (TexDesc->Format != TEX_FORMAT_UNKNOWN)) goto LAB_007255bf;
  }
  FormatString<char[26],char[135]>
            ((string *)local_70,(Diligent *)"Debug expression failed:\n",
             (char (*) [26])
             "TexDesc.MipLevels > 0 && TexDesc.GetArraySize() > 0 && TexDesc.Width > 0 && TexDesc.Height > 0 && TexDesc.Format != TEX_FORMAT_UNKNOWN"
             ,Args_1);
  DebugAssertionFailed
            ((Char *)CONCAT44(local_70._4_4_,local_70._0_4_),"GetStagingTextureLocationOffset",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
             ,0x93b);
  if ((undefined1 *)CONCAT44(local_70._4_4_,local_70._0_4_) != local_70 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_70._4_4_,local_70._0_4_),
                    CONCAT44(local_70._20_4_,local_70._16_4_) + 1);
  }
LAB_007255bf:
  RVar1 = TexDesc->Type;
  UVar6 = (TexDesc->field_3).ArraySize;
  UVar9 = 1;
  if ((0x1a8U >> (RVar1 & 0x1f) & 1) != 0) {
    UVar9 = UVar6;
  }
  uVar5 = (uint)RVar1;
  if (8 < uVar5) {
    UVar9 = 1;
  }
  if ((UVar9 <= ArraySlice) || (TexDesc->MipLevels <= MipLevel)) {
    if ((8 < uVar5) || ((0x1a8U >> (uVar5 & 0x1f) & 1) == 0)) {
      UVar6 = 1;
    }
    if (UVar6 != ArraySlice || MipLevel != 0) {
      FormatString<char[26],char[125]>
                ((string *)local_70,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "ArraySlice < TexDesc.GetArraySize() && MipLevel < TexDesc.MipLevels || ArraySlice == TexDesc.GetArraySize() && MipLevel == 0"
                 ,(char (*) [125])(ulong)RVar1);
      DebugAssertionFailed
                ((Char *)CONCAT44(local_70._4_4_,local_70._0_4_),"GetStagingTextureLocationOffset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x93c);
      if ((undefined1 *)CONCAT44(local_70._4_4_,local_70._0_4_) != local_70 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_70._4_4_,local_70._0_4_),
                        CONCAT44(local_70._20_4_,local_70._16_4_) + 1);
      }
    }
  }
  local_38 = LocationY;
  local_34 = LocationX;
  if (ArraySlice == 0) {
    UVar8 = 0;
  }
  else {
    UVar6 = 0;
    if (TexDesc->MipLevels == 0) {
      lVar12 = 0;
    }
    else {
      uVar5 = local_94 - (local_94 >> 1 & 0x55555555);
      uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333);
      lVar12 = 0;
      do {
        GetMipLevelProperties((MipLevelProperties *)local_70,TexDesc,UVar6);
        UVar8 = local_48;
        local_98 = local_94;
        if (((uVar5 >> 4) + uVar5 & 0xf0f0f0f) * 0x1010101 >> 0x18 != 1) {
          FormatString<char[12],unsigned_int,char[23]>
                    (&local_90,(Diligent *)"Alignment (",(char (*) [12])&local_98,
                     (uint *)") must be a power of 2",
                     (char (*) [23])CONCAT44(in_register_00000084,UVar11));
          DebugAssertionFailed
                    (local_90._M_dataplus._M_p,"AlignUp",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/../../../Common/interface/Align.hpp"
                     ,0x34);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
        lVar12 = lVar12 + (~(ulong)(local_98 - 1) & UVar8 + (local_98 - 1));
        UVar6 = UVar6 + 1;
      } while (UVar6 < TexDesc->MipLevels);
    }
    uVar7 = (ulong)ArraySlice;
    if ((0x1a8U >> (TexDesc->Type & 0x1f) & 1) == 0) {
      uVar7 = 1;
    }
    if (RESOURCE_DIM_TEX_CUBE_ARRAY < TexDesc->Type) {
      uVar7 = 1;
    }
    UVar8 = uVar7 * lVar12;
  }
  local_3c = ArraySlice;
  if (MipLevel != 0) {
    uVar5 = local_94 - (local_94 >> 1 & 0x55555555);
    uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333);
    UVar6 = 0;
    do {
      GetMipLevelProperties((MipLevelProperties *)local_70,TexDesc,UVar6);
      UVar2 = local_48;
      local_98 = local_94;
      if (((uVar5 >> 4) + uVar5 & 0xf0f0f0f) * 0x1010101 >> 0x18 != 1) {
        FormatString<char[12],unsigned_int,char[23]>
                  (&local_90,(Diligent *)"Alignment (",(char (*) [12])&local_98,
                   (uint *)") must be a power of 2",
                   (char (*) [23])CONCAT44(in_register_00000084,UVar11));
        DebugAssertionFailed
                  (local_90._M_dataplus._M_p,"AlignUp",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/../../../Common/interface/Align.hpp"
                   ,0x34);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
      UVar8 = UVar8 + (~(ulong)(local_98 - 1) & UVar2 + (local_98 - 1));
      UVar6 = UVar6 + 1;
    } while (MipLevel != UVar6);
  }
  UVar9 = local_34;
  UVar6 = local_38;
  UVar11 = 1;
  if ((0x1a8U >> (TexDesc->Type & 0x1f) & 1) != 0) {
    UVar11 = (TexDesc->field_3).ArraySize;
  }
  UVar3 = 1;
  if (TexDesc->Type < RESOURCE_DIM_NUM_DIMENSIONS) {
    UVar3 = UVar11;
  }
  if (UVar3 == local_3c) {
    if ((local_38 != 0 || local_34 != 0) || LocationZ != 0) {
      FormatString<char[60]>
                ((string *)local_70,
                 (char (*) [60])"Staging buffer size is requested: location must be (0,0,0).");
      DebugAssertionFailed
                ((Char *)CONCAT44(local_70._4_4_,local_70._0_4_),"GetStagingTextureLocationOffset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x956);
      if ((undefined1 *)CONCAT44(local_70._4_4_,local_70._0_4_) != local_70 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_70._4_4_,local_70._0_4_),
                        CONCAT44(local_70._20_4_,local_70._16_4_) + 1);
      }
    }
  }
  else if ((local_38 != 0 || local_34 != 0) || LocationZ != 0) {
    GetMipLevelProperties((MipLevelProperties *)local_70,TexDesc,MipLevel);
    pTVar4 = GetTextureFormatAttribs(TexDesc->Format);
    if ((((uint)local_70._0_4_ <= UVar9) || ((uint)local_70._4_4_ <= UVar6)) ||
       ((uint)local_70._16_4_ <= LocationZ)) {
      FormatString<char[36]>(&local_90,(char (*) [36])"Specified location is out of bounds");
      DebugAssertionFailed
                (local_90._M_dataplus._M_p,"GetStagingTextureLocationOffset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x95d);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    if ((pTVar4->ComponentType == COMPONENT_TYPE_COMPRESSED) &&
       ((UVar9 % (uint)pTVar4->BlockWidth != 0 || (UVar6 % (uint)pTVar4->BlockHeight != 0)))) {
      FormatString<char[86]>
                (&local_90,
                 (char (*) [86])
                 "For compressed texture formats, location must be a multiple of compressed block size."
                );
      DebugAssertionFailed
                (local_90._M_dataplus._M_p,"GetStagingTextureLocationOffset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x961);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    bVar10 = 1;
    if (pTVar4->ComponentType != COMPONENT_TYPE_COMPRESSED) {
      bVar10 = pTVar4->NumComponents;
    }
    UVar8 = UVar8 + (ulong)bVar10 * (ulong)pTVar4->ComponentSize *
                    ((ulong)UVar9 / (ulong)pTVar4->BlockWidth) +
            ((ulong)(LocationZ * local_70._12_4_ + UVar6) / (ulong)pTVar4->BlockHeight) *
            local_70._24_8_;
  }
  return UVar8;
}

Assistant:

Uint64 GetStagingTextureLocationOffset(const TextureDesc& TexDesc,
                                       Uint32             ArraySlice,
                                       Uint32             MipLevel,
                                       Uint32             Alignment,
                                       Uint32             LocationX,
                                       Uint32             LocationY,
                                       Uint32             LocationZ)
{
    VERIFY_EXPR(TexDesc.MipLevels > 0 && TexDesc.GetArraySize() > 0 && TexDesc.Width > 0 && TexDesc.Height > 0 && TexDesc.Format != TEX_FORMAT_UNKNOWN);
    VERIFY_EXPR(ArraySlice < TexDesc.GetArraySize() && MipLevel < TexDesc.MipLevels || ArraySlice == TexDesc.GetArraySize() && MipLevel == 0);

    Uint64 Offset = 0;
    if (ArraySlice > 0)
    {
        Uint64 ArraySliceSize = 0;
        for (Uint32 mip = 0; mip < TexDesc.MipLevels; ++mip)
        {
            MipLevelProperties MipInfo = GetMipLevelProperties(TexDesc, mip);
            ArraySliceSize += AlignUp(MipInfo.MipSize, Alignment);
        }

        Offset = ArraySliceSize;
        if (TexDesc.IsArray())
            Offset *= ArraySlice;
    }

    for (Uint32 mip = 0; mip < MipLevel; ++mip)
    {
        MipLevelProperties MipInfo = GetMipLevelProperties(TexDesc, mip);
        Offset += AlignUp(MipInfo.MipSize, Alignment);
    }

    if (ArraySlice == TexDesc.GetArraySize())
    {
        VERIFY(LocationX == 0 && LocationY == 0 && LocationZ == 0,
               "Staging buffer size is requested: location must be (0,0,0).");
    }
    else if (LocationX != 0 || LocationY != 0 || LocationZ != 0)
    {
        const MipLevelProperties&   MipLevelAttribs = GetMipLevelProperties(TexDesc, MipLevel);
        const TextureFormatAttribs& FmtAttribs      = GetTextureFormatAttribs(TexDesc.Format);
        VERIFY(LocationX < MipLevelAttribs.LogicalWidth && LocationY < MipLevelAttribs.LogicalHeight && LocationZ < MipLevelAttribs.Depth,
               "Specified location is out of bounds");
        if (FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED)
        {
            VERIFY((LocationX % FmtAttribs.BlockWidth) == 0 && (LocationY % FmtAttribs.BlockHeight) == 0,
                   "For compressed texture formats, location must be a multiple of compressed block size.");
        }

        // For compressed-block formats, RowSize is the size of one compressed row.
        // For non-compressed formats, BlockHeight is 1.
        Offset += (LocationZ * MipLevelAttribs.StorageHeight + LocationY) / FmtAttribs.BlockHeight * MipLevelAttribs.RowSize;

        // For non-compressed formats, BlockWidth is 1.
        Offset += Uint64{LocationX / FmtAttribs.BlockWidth} * FmtAttribs.GetElementSize();

        // Note: this addressing complies with how Vulkan (as well as OpenGL/GLES and Metal) address
        // textures when copying data to/from buffers:
        //      address of (x,y,z) = bufferOffset + (((z * imageHeight) + y) * rowLength + x) * texelBlockSize; (18.4.1)
    }

    return Offset;
}